

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O1

void __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
::solver_inequalities_Zcoeff
          (solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer pmVar5;
  pointer pfVar6;
  undefined1 auVar7 [16];
  double *pdVar8;
  int *piVar9;
  ulong uVar10;
  rc_data *prVar11;
  subsolver_type *psVar12;
  bound_factor *pbVar13;
  undefined8 extraout_RAX;
  pointer *ppfVar14;
  long lVar15;
  ulong uVar16;
  size_t max_z_constraints;
  int iVar17;
  int iVar18;
  subsolver_type sVar19;
  pointer pfVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  *psVar24;
  solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  *psVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  
  (this->super_debug_logger<false>).ofs = (FILE *)0x0;
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  uVar23 = (ulong)(this->ap).m_rows_values.m_length;
  uVar10 = uVar23 * 8;
  pdVar8 = (double *)operator_new__(uVar10);
  memset(pdVar8,0,uVar10);
  (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar8;
  uVar23 = uVar23 << 2;
  piVar9 = (int *)operator_new__(uVar23);
  memset(piVar9,0,uVar23);
  (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar9;
  pmVar5 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)*(pointer *)
                  ((long)&(pmVar5->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl + 8) -
           *(long *)&(pmVar5->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl >> 3;
  lVar15 = (long)(csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar5;
  if (lVar15 != 0x28) {
    lVar15 = (lVar15 >> 3) * -0x3333333333333333 + -1;
    ppfVar14 = (pointer *)
               ((long)&pmVar5[1].elements.
                       super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                       ._M_impl + 8);
    do {
      uVar23 = (long)*ppfVar14 - (long)((_Vector_impl_data *)(ppfVar14 + -1))->_M_start >> 3;
      if (uVar10 <= uVar23) {
        uVar10 = uVar23;
      }
      ppfVar14 = ppfVar14 + 5;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  uVar10 = -(ulong)(uVar10 >> 0x3c != 0) | uVar10 << 4;
  prVar11 = (rc_data *)operator_new__(uVar10);
  memset(prVar11,0,uVar10);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_false>
  ._M_head_impl = prVar11;
  uVar23 = (ulong)m_;
  psVar12 = (subsolver_type *)operator_new__(uVar23);
  memset(psVar12,0,uVar23);
  (this->Z)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_false>
  ._M_head_impl = psVar12;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar23;
  uVar10 = SUB168(auVar7 * ZEXT816(0xc),0);
  if (SUB168(auVar7 * ZEXT816(0xc),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pbVar13 = (bound_factor *)operator_new__(uVar10);
  memset(pbVar13,0,uVar10);
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_false>
  ._M_head_impl = pbVar13;
  uVar23 = uVar23 << 3;
  if (m_ < 0) {
    uVar23 = 0xffffffffffffffff;
  }
  pdVar8 = (double *)operator_new__(uVar23);
  memset(pdVar8,0,uVar23);
  (this->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar8;
  (this->bb).subvector.m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bb).subvector.m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->bb).subvector.m_container.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->bb).subvector.m_container.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->bb).subvector.m_free_list_head = 0xffffffff;
  auVar26 = ZEXT432(0) << 0x40;
  (this->bb).items =
       (vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item>_>
        )auVar26._0_24_;
  (this->bb).nodes.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar26._24_8_;
  *(undefined1 (*) [32])
   &(this->bb).items.
    super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar26;
  p_Var1 = &(this->ex).constraints._M_t._M_impl.super__Rb_tree_header;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  auVar27 = ZEXT464(0) << 0x40;
  (this->ex).items =
       (vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
        )auVar27._0_24_;
  (this->ex).flat_constraints = (vector<int,_std::allocator<int>_>)auVar27._24_24_;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar27._48_8_;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar27._56_8_;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  uVar10 = ((long)(csts->
                  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(csts->
                  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  uVar23 = 0;
  max_z_constraints = 0;
  if ((int)uVar10 != 0) {
    uVar21 = 0;
    max_z_constraints = 0;
    uVar23 = 0;
    psVar24 = (solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
               *)0x0;
    do {
      psVar12 = (this->Z)._M_t.
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_false>
                ._M_head_impl;
      psVar12[uVar21] = linear;
      pmVar5 = (csts->
               super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pfVar20 = *(pointer *)
                 &pmVar5[uVar21].elements.
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl;
      pfVar6 = *(pointer *)
                ((long)&pmVar5[uVar21].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar20 == pfVar6) {
        uVar16 = 0;
        iVar17 = 0;
        iVar18 = 0;
        psVar25 = psVar24;
      }
      else {
        piVar9 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl + (int)psVar24;
        lVar15 = 0;
        iVar18 = 0;
        iVar17 = 0;
        do {
          if (pfVar20->factor == 0) {
            itm::solver_inequalities_Zcoeff();
            goto LAB_00589a2f;
          }
          *piVar9 = pfVar20->factor;
          uVar2 = pfVar20->factor;
          uVar22 = 0;
          if ((int)uVar2 < 0) {
            uVar22 = uVar2;
          }
          if (uVar2 - 2 < 0xfffffffd) {
            psVar12[uVar21] = branch_and_bound;
          }
          iVar17 = iVar17 + (~((int)uVar2 >> 0x1f) & uVar2);
          iVar18 = iVar18 + uVar22;
          pfVar20 = pfVar20 + 1;
          piVar9 = piVar9 + 1;
          lVar15 = lVar15 + -1;
        } while (pfVar20 != pfVar6);
        uVar16 = -lVar15;
        psVar25 = (solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
                   *)(ulong)(uint)((int)psVar24 - (int)lVar15);
      }
      if (psVar12[uVar21] == branch_and_bound && uVar16 < 10) {
        psVar12[uVar21] = exhaustive;
      }
      pmVar5 = pmVar5 + uVar21;
      iVar3 = pmVar5->min;
      iVar4 = pmVar5->max;
      if (iVar3 == iVar4) {
        pbVar13 = (this->b)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_false>
                  ._M_head_impl;
        pbVar13[uVar21].min = iVar3;
        iVar17 = iVar4;
      }
      else {
        if ((iVar3 <= iVar18) || (iVar17 <= iVar4)) {
          if (psVar12[uVar21] == branch_and_bound) {
            sVar19 = unconstrained_branch_and_bound;
          }
          else {
            if (psVar12[uVar21] != exhaustive) goto LAB_00589961;
            sVar19 = unconstrained_exhaustive;
          }
          psVar12[uVar21] = sVar19;
        }
LAB_00589961:
        if (iVar3 < iVar18) {
          iVar3 = iVar18;
        }
        pbVar13 = (this->b)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_false>
                  ._M_head_impl;
        pbVar13[uVar21].min = iVar3;
        if (pmVar5->max < iVar17) {
          iVar17 = pmVar5->max;
        }
      }
      pbVar13[uVar21].max = iVar17;
      if (uVar16 < uVar23) {
        uVar16 = uVar23;
      }
      uVar23 = uVar16;
      if ((psVar12[uVar21] | unconstrained_branch_and_bound) == unconstrained_exhaustive) {
        pbVar13 = (this->b)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_false>
                  ._M_head_impl;
        exhaustive_solver<baryonyx::itm::minimize_tag,double>::
        build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
                  ((exhaustive_solver<baryonyx::itm::minimize_tag,double> *)&this->ex,(int)uVar21,
                   &pmVar5->elements,pbVar13[uVar21].min,pbVar13[uVar21].max);
        max_z_constraints = max_z_constraints + 1;
      }
      pbVar13 = (this->b)._M_t.
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_false>
                ._M_head_impl;
      psVar24 = this;
      if (pbVar13[uVar21].max < pbVar13[uVar21].min) {
LAB_00589a2f:
        itm::solver_inequalities_Zcoeff();
        pbVar13 = (psVar24->b)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_false>
                  ._M_head_impl;
        if (pbVar13 != (bound_factor *)0x0) {
          operator_delete__(pbVar13);
        }
        (psVar24->b)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_false>
        ._M_head_impl = (bound_factor *)0x0;
        psVar12 = (psVar24->Z)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_false>
                  ._M_head_impl;
        if (psVar12 != (subsolver_type *)0x0) {
          operator_delete__(psVar12);
        }
        (psVar24->Z)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_false>
        ._M_head_impl = (subsolver_type *)0x0;
        prVar11 = (psVar24->R)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_false>
                  ._M_head_impl;
        if (prVar11 != (rc_data *)0x0) {
          operator_delete__(prVar11);
        }
        (psVar24->R)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_false>
        ._M_head_impl = (rc_data *)0x0;
        piVar9 = (psVar24->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        if (piVar9 != (int *)0x0) {
          operator_delete__(piVar9);
        }
        (psVar24->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
        pdVar8 = (psVar24->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (psVar24->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
        sparse_matrix<int>::~sparse_matrix(&this->ap);
        _Unwind_Resume(extraout_RAX);
      }
      uVar21 = uVar21 + 1;
      psVar24 = psVar25;
    } while (uVar21 != (uVar10 & 0xffffffff));
  }
  if (max_z_constraints != 0) {
    exhaustive_solver<baryonyx::itm::minimize_tag,_double>::reserve
              (&this->ex,uVar23,max_z_constraints);
  }
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item>_>
  ::reserve(&(this->bb).items,uVar23);
  std::vector<signed_char,_std::allocator<signed_char>_>::reserve
            ((vector<signed_char,_std::allocator<signed_char>_> *)&this->bb,uVar23 << 10);
  return;
}

Assistant:

solver_inequalities_Zcoeff(random_engine& rng_,
                               int m_,
                               int n_,
                               const cost_type& c_,
                               const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_Zcoeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , Z(std::make_unique<subsolver_type[]>(m_))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        // Count the maximum function elements in the constraint where a least
        // one coefficient is in Z. To be use with the branch-and-bound and
        // exhaustive solvers.
        std::size_t z_variables_max = 0;

        // Count the maximum constraint number where at leat one coefficient is
        // in Z. To be used with the exhaustive solver.
        std::size_t z_constraint_exhaustive = 0;

        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;
            std::size_t local_z_variables_max = 0;

            Z[i] =
              subsolver_type::linear; // Default, Z solver use the classical
                                      // Bastert selection for 101 problem.

            for (const auto& cst : csts[i].elements) {
                bx_ensures(cst.factor);
                A[id++] = cst.factor;
                ++local_z_variables_max;

                if (cst.factor > 0)
                    upper += cst.factor;
                else
                    lower += cst.factor;

                if (cst.factor < -1 || cst.factor > 1) {
                    Z[i] = subsolver_type::branch_and_bound;
                }
            }

            if (Z[i] == subsolver_type::branch_and_bound &&
                local_z_variables_max < maximum_factor_exhaustive_solver)
                Z[i] = subsolver_type::exhaustive;

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                if (lower >= csts[i].min || upper <= csts[i].max) {
                    if (Z[i] == subsolver_type::branch_and_bound)
                        Z[i] = subsolver_type::unconstrained_branch_and_bound;
                    else if (Z[i] == subsolver_type::exhaustive)
                        Z[i] = subsolver_type::unconstrained_exhaustive;
                }

                b[i].min = std::max(lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            z_variables_max = std::max(z_variables_max, local_z_variables_max);

            if (Z[i] == subsolver_type::exhaustive ||
                Z[i] == subsolver_type::unconstrained_exhaustive) {
                z_constraint_exhaustive++;
                ex.build_constraints(i, csts[i].elements, b[i].min, b[i].max);
            }

            logger::log("Is Z: {} ({}) with {} <= {}\n",
                        static_cast<int>(Z[i]),
                        local_z_variables_max,
                        b[i].min,
                        b[i].max);

            bx_ensures(b[i].min <= b[i].max);
        }

        if (z_constraint_exhaustive > 0)
            ex.reserve(z_variables_max, z_constraint_exhaustive);

        bb.reserve(z_variables_max);
    }